

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O2

Plausibility __thiscall
capnp::compiler::CompilerMain::isPlausiblyPacked
          (CompilerMain *this,ArrayPtr<const_unsigned_char> prefix,
          Function<capnp::compiler::CompilerMain::Plausibility_(kj::ArrayPtr<const_unsigned_char>)>
          *checkUnpacked)

{
  byte *begin;
  byte bVar1;
  Iface *pIVar2;
  Plausibility PVar3;
  ulong uVar4;
  uint i;
  uint uVar5;
  byte *pbVar6;
  byte *end;
  byte b;
  Vector<unsigned_char> unpacked;
  Repeat<unsigned_char> local_70;
  Function<capnp::compiler::CompilerMain::Plausibility_(kj::ArrayPtr<const_unsigned_char>)>
  *local_60;
  ArrayBuilder<unsigned_char> local_58;
  size_t sVar7;
  
  end = prefix.ptr;
  local_58.ptr = (uchar *)0x0;
  local_58.pos = (RemoveConst<unsigned_char> *)0x0;
  local_58.endPtr = (uchar *)0x0;
  local_58.disposer = (ArrayDisposer *)&kj::NullArrayDisposer::instance;
  sVar7 = 0x400;
  if ((long)prefix.size_ < 0x400) {
    sVar7 = prefix.size_;
  }
  pbVar6 = end + sVar7;
  local_60 = checkUnpacked;
  while (end < pbVar6) {
    bVar1 = *end;
    end = end + 1;
    uVar5 = 0;
    while ((uVar5 < 8 && (end < pbVar6))) {
      if ((bVar1 >> (uVar5 & 0x1f) & 1) == 0) {
        local_70._0_4_ = 0;
        kj::Vector<unsigned_char>::add<int>((Vector<unsigned_char> *)&local_58,(int *)&local_70);
      }
      else {
        local_70.value = *end;
        if (*end == 0) {
          PVar3 = IMPOSSIBLE;
          goto LAB_0011f5c6;
        }
        kj::Vector<unsigned_char>::add<unsigned_char&>
                  ((Vector<unsigned_char> *)&local_58,&local_70.value);
        end = end + 1;
      }
      uVar5 = uVar5 + 1;
    }
    if (end == pbVar6) break;
    if (bVar1 == 0xff) {
      begin = end + 1;
      uVar4 = (long)pbVar6 - (long)begin;
      if ((ulong)*end << 3 <= uVar4) {
        uVar4 = (ulong)*end << 3;
      }
      end = end + uVar4 + 1;
      kj::Vector<unsigned_char>::addAll<unsigned_char_const*>
                ((Vector<unsigned_char> *)&local_58,begin,end);
    }
    else if (bVar1 == 0) {
      local_70.count = (ulong)*end << 3;
      local_70._0_4_ = (uint)(uint3)local_70._1_3_ << 8;
      kj::Vector<unsigned_char>::addAll<kj::Repeat<unsigned_char>>
                ((Vector<unsigned_char> *)&local_58,&local_70);
      end = end + 1;
    }
  }
  pIVar2 = (local_60->impl).ptr;
  PVar3 = (**pIVar2->_vptr_Iface)(pIVar2,local_58.ptr,(long)local_58.pos - (long)local_58.ptr);
LAB_0011f5c6:
  kj::ArrayBuilder<unsigned_char>::dispose(&local_58);
  return PVar3;
}

Assistant:

Plausibility isPlausiblyPacked(kj::ArrayPtr<const byte> prefix,
      kj::Function<Plausibility(kj::ArrayPtr<const byte>)> checkUnpacked) {
    kj::Vector<byte> unpacked;

    // Try to unpack a prefix so that we can check it.
    const byte* pos = prefix.begin();
    const byte* end = prefix.end();
    if (end - pos > 1024) {
      // Don't bother unpacking more than 1k.
      end = pos + 1024;
    }
    while (pos < end) {
      byte tag = *pos++;
      for (uint i = 0; i < 8 && pos < end; i++) {
        if (tag & (1 << i)) {
          byte b = *pos++;
          if (b == 0) {
            // A zero byte should have been deflated away.
            return IMPOSSIBLE;
          }
          unpacked.add(b);
        } else {
          unpacked.add(0);
        }
      }

      if (pos == end) {
        break;
      }

      if (tag == 0) {
        uint count = *pos++ * 8;
        unpacked.addAll(kj::repeat(byte(0), count));
      } else if (tag == 0xff) {
        uint count = *pos++ * 8;
        size_t available = end - pos;
        uint n = kj::min(count, available);
        unpacked.addAll(pos, pos + n);
        pos += n;
      }
    }

    return checkUnpacked(unpacked);
  }